

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool crnd::crnd_get_texture_info(void *pData,uint32 data_size,crn_texture_info *pInfo)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  crn_header *pcVar4;
  uint32 uVar5;
  
  if ((((pInfo != (crn_texture_info *)0x0 && pData != (void *)0x0) && 0x49 < data_size) &&
      (pInfo->m_struct_size == 0x28)) &&
     (pcVar4 = crnd_get_header(pData,data_size), pcVar4 != (crn_header *)0x0)) {
    uVar2 = *(ushort *)(pcVar4->m_width).m_buf;
    pInfo->m_width = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    uVar2 = *(ushort *)(pcVar4->m_height).m_buf;
    pInfo->m_height = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    pInfo->m_levels = (uint)(pcVar4->m_levels).m_buf[0];
    pInfo->m_faces = (uint)(pcVar4->m_faces).m_buf[0];
    pInfo->m_format = (ulong)(pcVar4->m_format).m_buf[0];
    bVar1 = (pcVar4->m_format).m_buf[0];
    if ((0xb < bVar1) || (uVar5 = 8, (0xe01U >> (bVar1 & 0x1f) & 1) == 0)) {
      uVar5 = (uint)(bVar1 != 0xd) * 8 + 8;
    }
    pInfo->m_bytes_per_block = uVar5;
    uVar3 = *(uint *)(pcVar4->m_userdata0).m_buf;
    pInfo->m_userdata0 =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)(pcVar4->m_userdata1).m_buf;
    pInfo->m_userdata1 =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    return true;
  }
  return false;
}

Assistant:

bool crnd_get_texture_info(const void* pData, uint32 data_size, crn_texture_info* pInfo)
    {
        if ((!pData) || (data_size < sizeof(crn_header)) || (!pInfo))
            return false;

        if (pInfo->m_struct_size != sizeof(crn_texture_info))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        pInfo->m_width = pHeader->m_width;
        pInfo->m_height = pHeader->m_height;
        pInfo->m_levels = pHeader->m_levels;
        pInfo->m_faces = pHeader->m_faces;
        pInfo->m_format = static_cast<crn_format>((uint32)pHeader->m_format);
        pInfo->m_bytes_per_block = pHeader->m_format == cCRNFmtDXT1 || pHeader->m_format == cCRNFmtDXT5A || pHeader->m_format == cCRNFmtETC1 || pHeader->m_format == cCRNFmtETC2 || pHeader->m_format == cCRNFmtETC1S ? 8 : 16;
        pInfo->m_userdata0 = pHeader->m_userdata0;
        pInfo->m_userdata1 = pHeader->m_userdata1;

        return true;
    }